

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

CBString * visibleAsciiOrHex(CBString *__return_storage_ptr__,UINT8 *bytes,UINT32 length)

{
  UINT8 *pUVar1;
  bool bVar2;
  ulong uVar3;
  UINT8 *pUVar4;
  CBString *b;
  ulong uVar5;
  ulong uVar6;
  CBString hexString;
  CBString asciiString;
  CBString local_78;
  CBString local_60;
  CBString local_48;
  
  Bstrlib::CBString::CBString(&local_60);
  Bstrlib::CBString::CBString(&local_78);
  if (length != 0) {
    uVar6 = (ulong)(length - 1);
    pUVar4 = bytes + 1;
    bVar2 = true;
    uVar5 = 0;
    do {
      usprintf(&local_48,"%02X",(ulong)bytes[uVar5]);
      Bstrlib::CBString::operator+=(&local_78,&local_48);
      Bstrlib::CBString::~CBString(&local_48);
      if (((uVar5 == 0) || (!bVar2)) || (bytes[uVar5] != '\0')) {
        if ((byte)(bytes[uVar5] + 0x81) < 0xa1) {
          bVar2 = false;
        }
      }
      else {
        uVar3 = 0;
        do {
          if (uVar6 == uVar3) goto LAB_0012e176;
          pUVar1 = pUVar4 + uVar3;
          uVar3 = uVar3 + 1;
        } while (*pUVar1 == '\0');
        bVar2 = false;
LAB_0012e176:
        if (bVar2) break;
      }
      if (bVar2) {
        usprintf(&local_48,"%c",(ulong)bytes[uVar5]);
        Bstrlib::CBString::operator+=(&local_60,&local_48);
        Bstrlib::CBString::~CBString(&local_48);
      }
      uVar5 = uVar5 + 1;
      uVar6 = uVar6 - 1;
      pUVar4 = pUVar4 + 1;
    } while (uVar5 != length);
    b = &local_78;
    if (!bVar2) goto LAB_0012e191;
  }
  b = &local_60;
LAB_0012e191:
  Bstrlib::CBString::CBString(__return_storage_ptr__,b);
  Bstrlib::CBString::~CBString(&local_78);
  Bstrlib::CBString::~CBString(&local_60);
  return __return_storage_ptr__;
}

Assistant:

UString visibleAsciiOrHex(UINT8* bytes, UINT32 length)
{
    bool ascii = true;
    UString asciiString;
    UString hexString;
    
    for (UINT32 i = 0; i < length; i++) {
        hexString += usprintf("%02X", bytes[i]);
        
        if (ascii && i > 0 && bytes[i] == '\x00') { // Check for the rest of the buffer being zeroes, and make the whole previous string visible, if so
            for (UINT32 j = i + 1; j < length; j++) {
                if (bytes[j] != '\x00') {
                    ascii = false;
                    break;
                }
            }
            
            if (ascii) {
                // No need to continue iterating over every symbol, we did it already
                break;
            }
        }
        else if (bytes[i] < '\x20' || bytes[i] > '\x7E') {  // Explicit ascii codes to avoid locale dependency
            ascii = false;
        }
        
        if (ascii) {
            asciiString += usprintf("%c", bytes[i]);
        }
    }
    
    if (ascii) {
        return asciiString;
    }
    
    return hexString;
}